

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int asn1_object_dump(ASN1_OBJECT *a,char *buf,size_t len)

{
  int buf_len;
  int iVar1;
  int ilen;
  int i;
  size_t len_local;
  char *buf_local;
  ASN1_OBJECT *a_local;
  
  buf_len = (int)len;
  if (buf_len < 0) {
    a_local._4_4_ = 1;
  }
  else {
    iVar1 = i2t_ASN1_OBJECT(buf,buf_len,(ASN1_OBJECT *)a);
    if (iVar1 < buf_len) {
      a_local._4_4_ = 0;
    }
    else {
      a_local._4_4_ = 1;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int asn1_object_dump(ASN1_OBJECT *a, char *buf, size_t len)
{
  int i, ilen;

  ilen = (int)len;
  if(ilen < 0)
    return 1; /* buffer too big */

  i = i2t_ASN1_OBJECT(buf, ilen, a);

  if(i >= ilen)
    return 1; /* buffer too small */

  return 0;
}